

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

double __thiscall sophia_interface::LUZDIS(sophia_interface *this,int KFL1,int KFL2,double PR)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  sophia_interface *this_00;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_68;
  
  uVar3 = -KFL1;
  if (0 < KFL1) {
    uVar3 = KFL1;
  }
  this_00 = (sophia_interface *)(ulong)(uint)-KFL2;
  if (0 < KFL2) {
    this_00 = (sophia_interface *)(ulong)(uint)KFL2;
  }
  uVar6 = (ulong)uVar3;
  if (9 < uVar3) {
    uVar6 = ((ulong)uVar3 / 1000) % 10;
  }
  uVar5 = (uint)uVar6;
  if (MSTJ[10] != 1) {
    if ((MSTJ[10] < 4) && (3 < uVar5 || MSTJ[10] != 3)) {
      lVar4 = 0x1d0;
      if (MSTJ[0x5a] != 1) {
        lVar4 = (ulong)(uVar5 + (uVar5 == 0)) * 8 + 0x188;
      }
      dVar17 = *(double *)((long)PARJ + lVar4);
      while( true ) {
        dVar18 = RLU(this_00,false);
        if (0.0 <= dVar17 && dVar17 <= 1.0) {
          dVar9 = RLU(this_00,false);
          if (dVar17 <= dVar9) {
            return dVar18;
          }
          dVar17 = pow(dVar18,0.3333333333333333);
          return 1.0 - dVar17;
        }
        if (dVar17 <= -1.0 || 0.0 <= dVar17) break;
        dVar9 = 1.0 - dVar18;
        dVar19 = RLU(this_00,false);
        dVar10 = dVar9 * dVar9 + dVar18 * -dVar17;
        if (dVar10 * dVar10 * dVar19 <= dVar17 * -4.0 * dVar18 * dVar9 * dVar9) {
          return dVar18;
        }
      }
      if (0.0 < dVar17) {
        dVar18 = pow(dVar18,1.0 / dVar17);
        dVar18 = 1.0 - dVar18;
      }
      if (0.0 <= dVar17) {
        return dVar18;
      }
      dVar17 = pow(dVar18,-1.0 / dVar17);
      return dVar17;
    }
  }
  pdVar7 = PARJ + 0x28;
  pdVar8 = PARJ + 0x29;
  if (MSTJ[0x5a] == 1) {
    pdVar7 = PARJ + 0x2a;
    pdVar8 = PARJ + 0x2b;
  }
  dVar17 = 1.0;
  if (9 < uVar3) {
    dVar17 = 1.0 - PARJ[0x2c];
  }
  dVar18 = *pdVar7;
  if (9 < (uint)this_00) {
    dVar18 = dVar18 + PARJ[0x2c];
    dVar17 = dVar17 + PARJ[0x2c];
  }
  if (((uint)MSTJ[10] < 4) || ((uVar5 & 0xe) != 4)) {
    if ((3 < (uint)MSTJ[10]) && (uVar5 - 6 < 3)) {
      dVar9 = PARJ[(ulong)(MSTJ[10] == 5) * 2 + 0x2d];
      pdVar7 = PMAS[0] + (uVar5 - 1);
      goto LAB_00127304;
    }
  }
  else {
    this_00 = (sophia_interface *)(ulong)(uVar5 == 5 && MSTJ[10] == 5);
    dVar9 = PARJ[(long)((long)this_00->K[0] + 0x29)];
    pdVar7 = PARF + uVar6 + 99;
LAB_00127304:
    dVar17 = dVar17 + dVar9 * *pdVar8 * *pdVar7 * *pdVar7;
  }
  dVar19 = *pdVar8 * PR;
  dVar9 = ABS(dVar17 + -1.0);
  if (dVar18 < 0.02) {
    if (dVar19 < dVar17) {
      dVar10 = dVar19 / dVar17;
      goto LAB_00127452;
    }
    dVar10 = 1.0;
  }
  else {
    if (0.01 <= ABS(dVar17 - dVar18)) {
      dVar10 = (dVar19 - dVar17) * (dVar19 - dVar17) + dVar18 * 4.0 * dVar19;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar11 = (((dVar19 + dVar17) - dVar10) * 0.5) / (dVar17 - dVar18);
      dVar10 = dVar11;
      if (((0.9999 < dVar11) && (100.0 < dVar19)) &&
         (dVar10 = 1.0 - dVar18 / dVar19, dVar11 <= dVar10)) {
        dVar10 = dVar11;
      }
    }
    else {
      dVar10 = dVar19 / (dVar19 + dVar17);
    }
LAB_00127452:
    if (dVar10 < 0.1) {
      dVar11 = dVar10 * 2.75;
      if (0.01 < dVar9) {
        dVar12 = pow(dVar11,1.0 - dVar17);
        local_68 = (1.0 - 1.0 / dVar12) / (dVar17 + -1.0) + 1.0;
      }
      else {
        local_68 = log(dVar11);
        local_68 = 1.0 - local_68;
        dVar12 = 0.0;
      }
      bVar1 = true;
      bVar2 = false;
      goto LAB_00127614;
    }
  }
  bVar1 = false;
  dVar11 = 0.0;
  if ((dVar10 <= 0.85) || (dVar19 <= 1.0)) {
    bVar2 = false;
    dVar12 = 0.0;
    local_68 = 0.0;
  }
  else {
    dVar12 = dVar17 / dVar19;
    dVar13 = SQRT(dVar12 * dVar12 + 4.0);
    dVar11 = log((dVar12 + dVar13) * dVar10 * 0.5);
    dVar11 = (-1.0 / dVar10 + dVar13) - dVar11 * dVar12;
    if (0.02 <= dVar18) {
      dVar12 = log(1.0 - dVar10);
      dVar11 = dVar11 + dVar12 * (dVar18 / dVar19);
    }
    dVar12 = 0.0;
    if (dVar11 <= 0.0) {
      dVar11 = 0.0;
    }
    if (dVar10 <= dVar11) {
      dVar11 = dVar10;
    }
    local_68 = (1.0 - dVar11) * dVar19 + 1.0;
    bVar2 = true;
    bVar1 = false;
  }
LAB_00127614:
  do {
    do {
      dVar13 = RLU(this_00,false);
      if (bVar1) {
        dVar14 = RLU(this_00,false);
        dVar16 = 1.0;
        if (dVar14 * local_68 <= 1.0) {
          dVar13 = dVar13 * dVar11;
        }
        else if (0.01 < dVar9) {
          dVar13 = pow(dVar13 * (1.0 - dVar12) + dVar12,1.0 / (1.0 - dVar17));
          dVar13 = 1.0 / dVar13;
          dVar16 = pow(dVar11 / dVar13,dVar17);
        }
        else {
          dVar13 = pow(dVar11,dVar13);
          dVar16 = dVar11 / dVar13;
        }
      }
      else if (bVar2) {
        dVar14 = RLU(this_00,false);
        dVar16 = 1.0;
        if (dVar14 * local_68 <= 1.0) {
          dVar13 = log(dVar13);
          dVar13 = dVar13 / dVar19 + dVar11;
          dVar16 = exp((dVar13 - dVar11) * dVar19);
        }
        else {
          dVar13 = dVar13 * (1.0 - dVar11) + dVar11;
        }
      }
      else {
        dVar16 = 1.0;
      }
    } while ((dVar13 <= 0.0) || (1.0 <= dVar13));
    dVar14 = log(dVar10 / dVar13);
    dVar14 = dVar14 * dVar17 + (-1.0 / dVar13 + 1.0 / dVar10) * dVar19;
    if (0.02 <= dVar18) {
      dVar15 = log((1.0 - dVar13) / (1.0 - dVar10));
      dVar14 = dVar14 + dVar15 * dVar18;
    }
    if (50.0 <= dVar14) {
      dVar14 = 50.0;
    }
    if (dVar14 <= -50.0) {
      dVar14 = -50.0;
    }
    dVar14 = exp(dVar14);
    dVar15 = RLU(this_00,false);
  } while (dVar14 < dVar16 * dVar15);
  return dVar13;
}

Assistant:

double sophia_interface::LUZDIS(int KFL1, int KFL2, double PR) {
// Purpose: to generate the longitudinal splitting variable Z.
    double Z = 0.;

    // Check if heavy flavour fragmentation. 
    int KFLA = std::abs(KFL1);
    int KFLB = std::abs(KFL2);
    int KFLH = KFLA;
    if (KFLA >= 10) KFLH = (KFLA / 1000) % 10;
 
    // Lund symmetric scaling function: determine parameters of shape. 
    if (MSTJ[10] == 1 || (MSTJ[10] == 3 && KFLH <= 3) || MSTJ[10] >= 4) {
        double FA = PARJ[40];
        if (MSTJ[90] == 1) FA = PARJ[42];
        if (KFLB >= 10) FA += PARJ[44];
        double FBB = PARJ[41];
        if (MSTJ[90] == 1) FBB = PARJ[43];
        double FB = FBB * PR;
        double FC = 1.;
        if (KFLA >= 10) FC -= PARJ[44];
        if (KFLB >= 10) FC += PARJ[44];
        if (MSTJ[10] >= 4 && KFLH >= 4 && KFLH <= 5) {
            double FRED = PARJ[45];
            if (MSTJ[10] == 5 && KFLH == 5) FRED = PARJ[46];
            FC += FRED * FBB * PARF[100 + KFLH - 1] * PARF[100 + KFLH - 1];
        } else if (MSTJ[10] >= 4 && KFLH >= 6 && KFLH <= 8) {
            double FRED = PARJ[45];
            if (MSTJ[10] == 5) FRED = PARJ[47];
            FC += FRED * FBB * PMAS[0][KFLH - 1] * PMAS[0][KFLH - 1];
        }
        int MC = 1;
        if (std::abs(FC - 1.) > 0.01) MC = 2;
 
        // Determine position of maximum. Special cases for a  =  0 or a  =  c. 
        double ZMAX = 0.;
        int MA = 0;
        if (FA < 0.02) {
            MA = 1;
            ZMAX = 1.;
            if (FC > FB) ZMAX = FB / FC;
        } else if (std::abs(FC-FA) < 0.01) {
            MA = 2;
            ZMAX = FB / (FB + FC);
        } else {
            MA = 3;
            ZMAX = 0.5 * (FB + FC - std::sqrt((FB - FC) * (FB - FC) + 4. * FA * FB)) / (FC - FA);
            if ((ZMAX > 0.9999) && (FB > 100.)) ZMAX = std::min(ZMAX, 1. - FA / FB);
        }
 
        // Subdivide z range if distribution very peaked near endpoint. 
        int MMAX = 2;
        double ZDIV = 0.;
        double FINT = 0.;
        double ZDIVC = 0.;
        if (ZMAX < 0.1) {
            MMAX = 1;
            ZDIV = 2.75 * ZMAX;
            if (MC == 1) {
                FINT = 1. - std::log(ZDIV);
            } else {
                ZDIVC = std::pow(ZDIV, 1. - FC);
                FINT = 1. + (1. - 1. / ZDIVC) / (FC - 1.);
            }
        } else if (ZMAX > 0.85 && FB > 1.) {
            MMAX = 3;
            double FSCB = std::sqrt(4. + (FC / FB) * (FC / FB));
            ZDIV = FSCB - 1. / ZMAX - (FC / FB) * std::log(ZMAX * 0.5 * (FSCB + FC / FB));
            if (MA >= 2) ZDIV += (FA / FB) * std::log(1. - ZMAX);
            ZDIV = std::min(ZMAX, std::max(0., ZDIV));
            FINT = 1. + FB * (1. - ZDIV);
        }

        // Choice of z, preweighted for peaks at low or high z.
        bool repeat100 = false;
        do {  // 100
            repeat100 = false;
            Z = RLU();
            double FPRE = 1.;
            if (MMAX == 1) {
                if (FINT * RLU() <= 1.) {
                    Z *= ZDIV;
                } else if (MC == 1) {
                    Z = std::pow(ZDIV, Z);
                    FPRE = ZDIV / Z;
                } else {
                    Z = 1. / std::pow(ZDIVC + Z * (1. - ZDIVC), 1. / (1. - FC));
                    FPRE = std::pow(ZDIV / Z, FC);
                }
            } else if (MMAX == 3) {
                if (FINT * RLU() <= 1.) {
                    Z = ZDIV + std::log(Z) / FB;
                    FPRE = std::exp(FB * (Z - ZDIV));
                } else {
                    Z = ZDIV + Z * (1. - ZDIV);
                }
            }

            // Weighting according to correct formula.
            if (Z <= 0. || Z >= 1.) {repeat100 = true; continue;}
            double FEXP = FC * std::log(ZMAX / Z) + FB * (1. / ZMAX - 1. / Z);
            if (MA >= 2) FEXP += FA * std::log((1. - Z) / (1. - ZMAX));
            double FVAL = std::exp(std::max(-50., std::min(50., FEXP)));
            if (FVAL < RLU() * FPRE) {repeat100 = true; continue;}
        } while (repeat100);

    // Generate z according to Field-Feynman, SLAC, (1-z)^c OR z^c.
    } else {
        double FC = PARJ[50 + std::max(1, KFLH) - 1];
        if (MSTJ[90] == 1) FC = PARJ[58];
        bool repeat110 = false;
        do {  // 110
            repeat110 = false;
            Z = RLU();
            if (FC >= 0. && FC <= 1.) {
                if (FC > RLU()) Z = 1. - std::pow(Z, 1. / 3.);
            } else if (FC > -1 && FC < 0.) {
                if (-4. * FC * Z * (1. - Z) * (1. - Z) < RLU() * std::pow((1. - Z) * (1. - Z) - FC * Z, 2)) {repeat110 = true; continue;}
            } else {
                if (FC > 0.) Z = 1. - std::pow(Z, (1. / FC));
                if (FC < 0.) Z = std::pow(Z, (-1. / FC));
            }
        } while (repeat110);
    }
    return Z;
}